

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendBuffer.h
# Opt level: O0

void __thiscall SendBuffer::SendBuffer(SendBuffer *this,int size)

{
  size_type __n;
  allocator<char> local_39;
  string local_38 [36];
  int local_14;
  SendBuffer *pSStack_10;
  int size_local;
  SendBuffer *this_local;
  
  local_14 = size;
  pSStack_10 = this;
  std::__cxx11::string::string((string *)this);
  __n = (size_type)local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__n,'\0',&local_39);
  std::__cxx11::string::operator=((string *)this,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  this->full = 0;
  this->read = 0;
  return;
}

Assistant:

SendBuffer(int size) {
    this->buf = std::string(size, '\0');
    full = 0;
    read = 0;
  }